

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

void reallymarkobject(global_State *g,GCObject *o)

{
  GCObject *o_00;
  UpVal *uv;
  Table *mt;
  lu_mem size;
  GCObject *o_local;
  global_State *g_local;
  
  (o->gch).marked = (o->gch).marked & 0xfc;
  switch((o->gch).tt) {
  case '\x04':
  case '\x14':
    mt = (Table *)((long)&(o->h).array[1].tt_ + 1);
    goto LAB_0010dd76;
  case '\x05':
    (o->h).gclist = g->gray;
    g->gray = o;
    break;
  case '\x06':
    (o->h).array = (TValue *)g->gray;
    g->gray = o;
    break;
  case '\a':
    o_00 = (GCObject *)(o->h).array;
    if ((o_00 != (GCObject *)0x0) && (((o_00->gch).marked & 3) != 0)) {
      reallymarkobject(g,o_00);
    }
    if (((o->h).node != (Node *)0x0) && (((((o->h).node)->i_val).tt_ & 0x300) != 0)) {
      reallymarkobject(g,(GCObject *)(o->h).node);
    }
    mt = (Table *)&((o->th).ci)->extra;
    goto LAB_0010dd76;
  case '\b':
    (o->th).gclist = g->gray;
    g->gray = o;
    break;
  case '\t':
    (o->p).gclist = g->gray;
    g->gray = o;
    break;
  case '\n':
    if (((((o->h).array)->tt_ & 0x40U) != 0) && (((byte)(((o->h).array)->value_).f[9] & 3) != 0)) {
      reallymarkobject(g,(((o->h).array)->value_).gc);
    }
    if ((o->h).array != (TValue *)&(o->h).node) {
      return;
    }
    mt = (Table *)0x28;
LAB_0010dd76:
    (o->gch).marked = (o->gch).marked | 4;
    g->GCmemtrav = (long)&mt->next + g->GCmemtrav;
    break;
  default:
    break;
  case '&':
    (o->h).array = (TValue *)g->gray;
    g->gray = o;
  }
  return;
}

Assistant:

static void reallymarkobject (global_State *g, GCObject *o) {
  lu_mem size;
  white2gray(o);
  switch (gch(o)->tt) {
    case LUA_TSHRSTR:
    case LUA_TLNGSTR: {
      size = sizestring(gco2ts(o));
      break;  /* nothing else to mark; make it black */
    }
    case LUA_TUSERDATA: {
      Table *mt = gco2u(o)->metatable;
      markobject(g, mt);
      markobject(g, gco2u(o)->env);
      size = sizeudata(gco2u(o));
      break;
    }
    case LUA_TUPVAL: {
      UpVal *uv = gco2uv(o);
      markvalue(g, uv->v);
      if (uv->v != &uv->u.value)  /* open? */
        return;  /* open upvalues remain gray */
      size = sizeof(UpVal);
      break;
    }
    case LUA_TLCL: {
      gco2lcl(o)->gclist = g->gray;
      g->gray = o;
      return;
    }
    case LUA_TCCL: {
      gco2ccl(o)->gclist = g->gray;
      g->gray = o;
      return;
    }
    case LUA_TTABLE: {
      linktable(gco2t(o), &g->gray);
      return;
    }
    case LUA_TTHREAD: {
      gco2th(o)->gclist = g->gray;
      g->gray = o;
      return;
    }
    case LUA_TPROTO: {
      gco2p(o)->gclist = g->gray;
      g->gray = o;
      return;
    }
    default: lua_assert(0); return;
  }
  gray2black(o);
  g->GCmemtrav += size;
}